

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O2

void __thiscall ColorTracker::~ColorTracker(ColorTracker *this)

{
  char cVar1;
  ostream *poVar2;
  char *pcVar3;
  
  cVar1 = cv::VideoCapture::isOpened();
  if (cVar1 != '\0') {
    cv::VideoCapture::release();
    cVar1 = cv::VideoCapture::isOpened();
    pcVar3 = "succeeded to release camera: ";
    if (cVar1 != '\0') {
      pcVar3 = "failed to release camera: ";
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->cameraId);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  cv::VideoCapture::~VideoCapture(&this->cap);
  return;
}

Assistant:

ColorTracker::~ColorTracker() noexcept{
    if (!this->cap.isOpened()){
        return;
    }
    this->cap.release();
	if (!this->cap.isOpened()) {
		cout << "succeeded to release camera: " << this->cameraId << endl;
	} else {
		cout << "failed to release camera: " << this->cameraId << endl;
	}
}